

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O1

base_uint<256U> * __thiscall base_uint<256U>::operator-=(base_uint<256U> *this,uint64_t b64)

{
  uint32_t *puVar1;
  int i;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined1 auVar5 [16];
  base_uint<256U> ret;
  base_uint<256U> b;
  base_uint<256U> local_60;
  undefined1 local_40 [24];
  uint32_t local_28 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint((base_uint<256U> *)local_40);
  local_40._8_16_ = (undefined1  [16])0x0;
  local_28[0] = 0;
  local_28[1] = 0;
  local_40._0_8_ = b64;
  base_uint(&local_60);
  lVar2 = 0;
  auVar5._8_4_ = 0xffffffff;
  auVar5._0_8_ = 0xffffffffffffffff;
  auVar5._12_4_ = 0xffffffff;
  do {
    *(undefined1 (*) [16])(local_60.pn + lVar2) =
         *(undefined1 (*) [16])(local_28 + lVar2 + -6) ^ auVar5;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 8);
  lVar2 = 0;
  do {
    puVar1 = local_60.pn + lVar2;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 != 0) break;
    bVar4 = lVar2 != 7;
    lVar2 = lVar2 + 1;
  } while (bVar4);
  lVar2 = 0;
  uVar3 = 0;
  do {
    uVar3 = (ulong)local_60.pn[lVar2] + this->pn[lVar2] + uVar3;
    this->pn[lVar2] = (uint32_t)uVar3;
    uVar3 = uVar3 >> 0x20;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator-=(uint64_t b64)
    {
        base_uint b;
        b = b64;
        *this += -b;
        return *this;
    }